

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O0

void add_contains_test(void)

{
  array_container_t *array;
  size_t x_5;
  size_t x_4;
  int x_3;
  size_t x_2;
  size_t x_1;
  size_t x;
  int expected_card;
  array_container_t *B;
  int in_stack_ffffffffffffffbc;
  array_container_t *in_stack_ffffffffffffffc0;
  array_container_t *arr;
  char *in_stack_ffffffffffffffc8;
  char *expression;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  array = array_container_create();
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc
              );
  for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 3) {
    array_container_add(in_stack_ffffffffffffffc0,
                        (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10));
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
    array_container_contains(array,(uint16_t)local_18);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
    _assert_int_equal(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
  }
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    array_container_contains(array,(uint16_t)local_20);
    _assert_int_equal(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
  }
  array_container_cardinality(array);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  for (local_28 = 0; local_28 < 0x10000; local_28 = local_28 + 3) {
    array_container_contains(array,(uint16_t)local_28);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
    array_container_remove
              (in_stack_ffffffffffffffc0,(uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10));
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
    _assert_int_equal(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
    array_container_contains(array,(uint16_t)local_28);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
  }
  array_container_cardinality(array);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  for (iVar1 = 0xffff; -1 < iVar1; iVar1 = iVar1 + -3) {
    array_container_add(in_stack_ffffffffffffffc0,
                        (uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10));
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    array_container_contains(array,(uint16_t)iVar1);
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    _assert_int_equal(CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                      (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  array_container_cardinality(array);
  _assert_int_equal(CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                    (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  for (expression = (char *)0x0; expression < (char *)0x10000; expression = expression + 1) {
    array_container_contains(array,(uint16_t)expression);
    _assert_int_equal(CONCAT44(iVar1,in_stack_ffffffffffffffd0),(unsigned_long)expression,
                      (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  for (arr = (array_container_t *)0x0; arr < (array_container_t *)0x10000;
      arr = (array_container_t *)((long)&arr->cardinality + 3)) {
    array_container_contains(array,(uint16_t)arr);
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),expression,(char *)arr,
                 in_stack_ffffffffffffffbc);
    array_container_remove(arr,(uint16_t)((uint)in_stack_ffffffffffffffbc >> 0x10));
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),expression,(char *)arr,
                 in_stack_ffffffffffffffbc);
    _assert_int_equal(CONCAT44(iVar1,in_stack_ffffffffffffffd0),(unsigned_long)expression,
                      (char *)arr,in_stack_ffffffffffffffbc);
    array_container_contains(array,(uint16_t)arr);
    _assert_true(CONCAT44(iVar1,in_stack_ffffffffffffffd0),expression,(char *)arr,
                 in_stack_ffffffffffffffbc);
  }
  array_container_free((array_container_t *)0x1035c9);
  return;
}

Assistant:

DEFINE_TEST(add_contains_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    int expected_card = 0;

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(array_container_cardinality(B), (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    assert_int_equal(array_container_cardinality(B), 0);

    for (int x = 65535; x >= 0; x -= 3) {
        assert_true(array_container_add(B, x));
        assert_true(array_container_contains(B, x));
        assert_int_equal(B->cardinality, ++expected_card);
        assert_false(B->cardinality > B->capacity);
    }

    assert_int_equal(array_container_cardinality(B), expected_card);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(array_container_contains(B, x), (x / 3 * 3 == x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_true(array_container_contains(B, x));
        assert_true(array_container_remove(B, x));
        assert_int_equal(B->cardinality, --expected_card);
        assert_false(array_container_contains(B, x));
    }

    array_container_free(B);
}